

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::move(QWidget *this,QPoint *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QWidgetPrivate *this_00;
  QWExtra *pQVar6;
  int iVar7;
  int iVar8;
  QTLWExtra *pQVar9;
  QWidgetData *pQVar10;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  setAttribute(this,WA_Moved,true);
  pQVar10 = this->data;
  uVar1 = (pQVar10->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  if ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) == 0) {
    if ((uVar1 & 1) != 0) {
      pQVar9 = QWidgetPrivate::topData(this_00);
      pQVar9->field_0xe1 = pQVar9->field_0xe1 | 1;
      pQVar10 = this->data;
    }
    QRect::moveTopLeft(&pQVar10->crect,p);
    setAttribute(this,WA_PendingMoveEvent,true);
  }
  else {
    if ((uVar1 & 1) != 0) {
      pQVar9 = QWidgetPrivate::topData(this_00);
      pQVar9->field_0xe1 = pQVar9->field_0xe1 & 0xfe;
      pQVar10 = this->data;
    }
    iVar2 = (pQVar10->crect).x1.m_i;
    iVar3 = (p->xp).m_i;
    iVar7 = x(this);
    iVar4 = (this->data->crect).y1.m_i;
    iVar5 = (p->yp).m_i;
    iVar8 = y(this);
    pQVar10 = this->data;
    QWidgetPrivate::setGeometry_sys
              (this_00,(iVar2 + iVar3) - iVar7,(iVar4 + iVar5) - iVar8,
               ((pQVar10->crect).x2.m_i - (pQVar10->crect).x1.m_i) + 1,
               ((pQVar10->crect).y2.m_i - (pQVar10->crect).y1.m_i) + 1,true);
    QWidgetPrivate::setDirtyOpaqueRegion(this_00);
  }
  pQVar6 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar6 != (QWExtra *)0x0) && ((pQVar6->field_0x7d & 1) != 0)) {
    QWindowContainer::parentWasMoved(this);
    return;
  }
  return;
}

Assistant:

void QWidget::move(const QPoint &p)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Moved);
    if (testAttribute(Qt::WA_WState_Created)) {
        if (isWindow())
            d->topData()->posIncludesFrame = false;
        d->setGeometry_sys(p.x() + geometry().x() - QWidget::x(),
                       p.y() + geometry().y() - QWidget::y(),
                       width(), height(), true);
        d->setDirtyOpaqueRegion();
    } else {
        // no frame yet: see also QWidgetPrivate::fixPosIncludesFrame(), QWindowPrivate::PositionPolicy.
        if (isWindow())
            d->topData()->posIncludesFrame = true;
        data->crect.moveTopLeft(p); // no frame yet
        setAttribute(Qt::WA_PendingMoveEvent);
    }

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasMoved(this);
}